

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::torrent_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_error_alert *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  string local_218;
  string local_1e8;
  string local_1c8;
  char local_1a8 [8];
  char msg [400];
  torrent_error_alert *this_local;
  
  msg._392_8_ = this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(&this->error);
  if (bVar1) {
    uVar2 = boost::system::error_code::value(&this->error);
    boost::system::error_code::message_abi_cxx11_(&local_1e8,&this->error);
    convert_from_native(&local_1c8,&local_1e8);
    uVar3 = std::__cxx11::string::c_str();
    pcVar4 = filename(this);
    snprintf(local_1a8,400," ERROR: (%d %s) %s",(ulong)uVar2,uVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    pcVar4 = filename(this);
    snprintf(local_1a8,400," ERROR: %s",pcVar4);
  }
  torrent_alert::message_abi_cxx11_(&local_218,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_218,local_1a8);
  std::__cxx11::string::~string((string *)&local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_error_alert::message() const
	{
		char msg[400];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), " ERROR: (%d %s) %s"
				, error.value(), convert_from_native(error.message()).c_str()
				, filename());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), " ERROR: %s", filename());
		}
		return torrent_alert::message() + msg;
	}